

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O0

int __thiscall arbiter::http::Curl::init(Curl *this,EVP_PKEY_CTX *ctx)

{
  CURL *pCVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  curl_slist *pcVar6;
  undefined8 in_RCX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  reference local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *h;
  const_iterator __end2;
  const_iterator __begin2;
  Headers *__range2;
  long lStack_80;
  anon_class_1_0_00000001 toLong;
  curl_version_info_data *versioninfo;
  string local_68;
  undefined1 local_48 [8];
  string path;
  Query *query_local;
  Headers *headers_local;
  string *rawPath_local;
  Curl *this_local;
  
  path.field_2._8_8_ = in_RCX;
  curl_slist_free_all(this->m_headers);
  this->m_headers = (curl_slist *)0x0;
  buildQueryString(&local_68,(Query *)path.field_2._8_8_);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx,
                   &local_68);
  ::std::__cxx11::string::~string((string *)&local_68);
  pCVar1 = this->m_curl;
  uVar4 = ::std::__cxx11::string::c_str();
  curl_easy_setopt(pCVar1,0x2712,uVar4);
  lStack_80 = curl_version_info(9);
  if ((*(uint *)(lStack_80 + 0x20) & 0x80) == 0) {
    curl_easy_setopt(this->m_curl,99,1);
  }
  curl_easy_setopt(this->m_curl,0x71,1);
  curl_easy_setopt(this->m_curl,0x2776,"");
  curl_easy_setopt(this->m_curl,0x13,1);
  curl_easy_setopt(this->m_curl,0x14,this->m_timeout);
  curl_easy_setopt(this->m_curl,0x9c,1000);
  curl_easy_setopt(this->m_curl,0xd4,1000);
  pCVar1 = this->m_curl;
  lVar5 = init::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&__range2 + 7),(bool)(this->m_verbose & 1));
  curl_easy_setopt(pCVar1,0x29,lVar5);
  pCVar1 = this->m_curl;
  lVar5 = init::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&__range2 + 7),
                     (bool)(this->m_followRedirect & 1));
  curl_easy_setopt(pCVar1,0x34,lVar5);
  pCVar1 = this->m_curl;
  lVar5 = init::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&__range2 + 7),(bool)(this->m_verifyPeer & 1)
                    );
  curl_easy_setopt(pCVar1,0x40,lVar5);
  bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_caPath);
  if (bVar2) {
    pCVar1 = this->m_curl;
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&this->m_caPath);
    uVar4 = ::std::__cxx11::string::c_str();
    curl_easy_setopt(pCVar1,0x2771,uVar4);
  }
  bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_caInfo);
  if (bVar2) {
    pCVar1 = this->m_curl;
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&this->m_caInfo);
    uVar4 = ::std::__cxx11::string::c_str();
    curl_easy_setopt(pCVar1,0x2751,uVar4);
  }
  bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_proxy);
  if (bVar2) {
    pCVar1 = this->m_curl;
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&this->m_proxy);
    uVar4 = ::std::__cxx11::string::c_str();
    curl_easy_setopt(pCVar1,0x2714,uVar4);
  }
  __end2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(in_RDX);
  h = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_RDX);
  while (bVar2 = ::std::operator!=(&__end2,(_Self *)&h), bVar2) {
    local_a8 = ::std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end2);
    pcVar6 = this->m_headers;
    ::std::operator+(&local_e8,&local_a8->first,": ");
    ::std::operator+(&local_c8,&local_e8,&local_a8->second);
    uVar4 = ::std::__cxx11::string::c_str();
    pcVar6 = (curl_slist *)curl_slist_append(pcVar6,uVar4);
    this->m_headers = pcVar6;
    ::std::__cxx11::string::~string((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end2);
  }
  iVar3 = ::std::__cxx11::string::~string((string *)local_48);
  return iVar3;
}

Assistant:

void Curl::init(
        const std::string rawPath,
        const Headers& headers,
        const Query& query)
{
#ifdef ARBITER_CURL
    // Reset our curl instance and header list.
    curl_slist_free_all(m_headers);
    m_headers = nullptr;

    // Set path.
    const std::string path(rawPath + buildQueryString(query));
    curl_easy_setopt(m_curl, CURLOPT_URL, path.c_str());

    curl_version_info_data* versioninfo = curl_version_info(CURLVERSION_NOW);
    if (!(versioninfo->features & CURL_VERSION_ASYNCHDNS))
    {
        curl_easy_setopt(m_curl, CURLOPT_NOSIGNAL, 1L);
    }

    // Substantially faster DNS lookups without IPv6.
    curl_easy_setopt(m_curl, CURLOPT_IPRESOLVE, CURL_IPRESOLVE_V4);

    // See https://curl.se/libcurl/c/CURLOPT_ACCEPT_ENCODING.html
    //
    // To aid applications not having to bother about what specific algorithms
    // this particular libcurl build supports, libcurl allows a zero-length
    // string to be set ("") to ask for an Accept-Encoding: header to be used
    // that contains all built-in supported encodings.
    curl_easy_setopt(m_curl, CURLOPT_ACCEPT_ENCODING, "");

    // Don't wait forever.  Use the low-speed options instead of the timeout
    // option to make the timeout a sliding window instead of an absolute.
    curl_easy_setopt(m_curl, CURLOPT_LOW_SPEED_LIMIT, 1L);
    curl_easy_setopt(m_curl, CURLOPT_LOW_SPEED_TIME, m_timeout);

    curl_easy_setopt(m_curl, CURLOPT_CONNECTTIMEOUT_MS, 1000L);
    curl_easy_setopt(m_curl, CURLOPT_ACCEPTTIMEOUT_MS, 1000L);

    auto toLong([](bool b) { return b ? 1L : 0L; });

    // Configuration options.
    curl_easy_setopt(m_curl, CURLOPT_VERBOSE, toLong(m_verbose));
    curl_easy_setopt(m_curl, CURLOPT_FOLLOWLOCATION, toLong(m_followRedirect));
    curl_easy_setopt(m_curl, CURLOPT_SSL_VERIFYPEER, toLong(m_verifyPeer));
    if (m_caPath) curl_easy_setopt(m_curl, CURLOPT_CAPATH, m_caPath->c_str());
    if (m_caInfo) curl_easy_setopt(m_curl, CURLOPT_CAINFO, m_caInfo->c_str());
    if (m_proxy) curl_easy_setopt(m_curl, CURLOPT_PROXY, m_proxy->c_str());

    // Insert supplied headers.
    for (const auto& h : headers)
    {
        m_headers = curl_slist_append(
                m_headers,
                (h.first + ": " + h.second).c_str());
    }
#else
    throw ArbiterError(fail);
#endif
}